

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O3

int ecp_normalize_jac_many(mbedtls_ecp_group *grp,mbedtls_ecp_point **T,size_t T_size)

{
  mbedtls_ecp_point *X;
  int iVar1;
  mbedtls_mpi *X_00;
  mbedtls_mpi *pmVar2;
  mbedtls_mpi *pmVar3;
  size_t sVar4;
  mbedtls_mpi Zi;
  mbedtls_mpi u;
  mbedtls_mpi ZZi;
  mbedtls_mpi local_78;
  mbedtls_mpi local_60;
  mbedtls_mpi local_48;
  
  if (T_size < 2) {
    iVar1 = ecp_normalize_jac(grp,*T);
    return iVar1;
  }
  X_00 = (mbedtls_mpi *)calloc(T_size,0x18);
  pmVar2 = X_00;
  sVar4 = T_size;
  if (X_00 == (mbedtls_mpi *)0x0) {
    iVar1 = -0x4d80;
  }
  else {
    do {
      mbedtls_mpi_init(pmVar2);
      sVar4 = sVar4 - 1;
      pmVar2 = pmVar2 + 1;
    } while (sVar4 != 0);
    mbedtls_mpi_init(&local_60);
    mbedtls_mpi_init(&local_78);
    mbedtls_mpi_init(&local_48);
    iVar1 = mbedtls_mpi_copy(X_00,&(*T)->Z);
    if (iVar1 == 0) {
      sVar4 = 1;
      pmVar2 = X_00;
      do {
        pmVar3 = pmVar2 + 1;
        iVar1 = mbedtls_mpi_mul_mpi(pmVar3,pmVar2,&T[sVar4]->Z);
        if ((iVar1 != 0) || (iVar1 = ecp_modp(pmVar3,grp), iVar1 != 0)) goto LAB_0012377a;
        mul_count = mul_count + 1;
        sVar4 = sVar4 + 1;
        pmVar2 = pmVar3;
      } while (T_size != sVar4);
      iVar1 = mbedtls_mpi_inv_mod(&local_60,X_00 + (T_size - 1),&grp->P);
      if (iVar1 == 0) {
        pmVar2 = X_00 + (T_size - 2);
        sVar4 = T_size;
        do {
          if (sVar4 == 1) {
            iVar1 = mbedtls_mpi_copy(&local_78,&local_60);
            if (iVar1 != 0) break;
          }
          else {
            iVar1 = mbedtls_mpi_mul_mpi(&local_78,&local_60,pmVar2);
            if ((iVar1 != 0) || (iVar1 = ecp_modp(&local_78,grp), iVar1 != 0)) break;
            mul_count = mul_count + 1;
            iVar1 = mbedtls_mpi_mul_mpi(&local_60,&local_60,&T[sVar4 - 1]->Z);
            if ((iVar1 != 0) || (iVar1 = ecp_modp(&local_60,grp), iVar1 != 0)) break;
            mul_count = mul_count + 1;
          }
          iVar1 = mbedtls_mpi_mul_mpi(&local_48,&local_78,&local_78);
          if ((iVar1 != 0) || (iVar1 = ecp_modp(&local_48,grp), iVar1 != 0)) break;
          mul_count = mul_count + 1;
          X = T[sVar4 - 1];
          iVar1 = mbedtls_mpi_mul_mpi(&X->X,&X->X,&local_48);
          if ((iVar1 != 0) || (iVar1 = ecp_modp(&X->X,grp), iVar1 != 0)) break;
          mul_count = mul_count + 1;
          pmVar3 = &T[sVar4 - 1]->Y;
          iVar1 = mbedtls_mpi_mul_mpi(pmVar3,pmVar3,&local_48);
          if ((iVar1 != 0) || (iVar1 = ecp_modp(pmVar3,grp), iVar1 != 0)) break;
          mul_count = mul_count + 1;
          pmVar3 = &T[sVar4 - 1]->Y;
          iVar1 = mbedtls_mpi_mul_mpi(pmVar3,pmVar3,&local_78);
          if ((iVar1 != 0) || (iVar1 = ecp_modp(pmVar3,grp), iVar1 != 0)) break;
          mul_count = mul_count + 1;
          iVar1 = mbedtls_mpi_shrink(&T[sVar4 - 1]->X,(grp->P).n);
          if ((iVar1 != 0) || (iVar1 = mbedtls_mpi_shrink(&T[sVar4 - 1]->Y,(grp->P).n), iVar1 != 0))
          break;
          mbedtls_mpi_free(&T[sVar4 - 1]->Z);
          pmVar2 = pmVar2 + -1;
          iVar1 = 0;
          sVar4 = sVar4 - 1;
          if (sVar4 == 0) break;
        } while( true );
      }
    }
LAB_0012377a:
    mbedtls_mpi_free(&local_60);
    mbedtls_mpi_free(&local_78);
    mbedtls_mpi_free(&local_48);
    pmVar2 = X_00;
    do {
      mbedtls_mpi_free(pmVar2);
      pmVar2 = pmVar2 + 1;
      T_size = T_size - 1;
    } while (T_size != 0);
    free(X_00);
  }
  return iVar1;
}

Assistant:

static int ecp_normalize_jac_many( const mbedtls_ecp_group *grp,
                                   mbedtls_ecp_point *T[], size_t T_size )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i;
    mbedtls_mpi *c, u, Zi, ZZi;

    if( T_size < 2 )
        return( ecp_normalize_jac( grp, *T ) );

#if defined(MBEDTLS_ECP_NORMALIZE_JAC_MANY_ALT)
    if( mbedtls_internal_ecp_grp_capable( grp ) )
        return( mbedtls_internal_ecp_normalize_jac_many( grp, T, T_size ) );
#endif

    if( ( c = mbedtls_calloc( T_size, sizeof( mbedtls_mpi ) ) ) == NULL )
        return( MBEDTLS_ERR_ECP_ALLOC_FAILED );

    for( i = 0; i < T_size; i++ )
        mbedtls_mpi_init( &c[i] );

    mbedtls_mpi_init( &u ); mbedtls_mpi_init( &Zi ); mbedtls_mpi_init( &ZZi );

    /*
     * c[i] = Z_0 * ... * Z_i
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &c[0], &T[0]->Z ) );
    for( i = 1; i < T_size; i++ )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &c[i], &c[i-1], &T[i]->Z ) );
    }

    /*
     * u = 1 / (Z_0 * ... * Z_n) mod P
     */
    MBEDTLS_MPI_CHK( mbedtls_mpi_inv_mod( &u, &c[T_size-1], &grp->P ) );

    for( i = T_size - 1; ; i-- )
    {
        /*
         * Zi = 1 / Z_i mod p
         * u = 1 / (Z_0 * ... * Z_i) mod P
         */
        if( i == 0 ) {
            MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &Zi, &u ) );
        }
        else
        {
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &Zi, &u, &c[i-1]  ) );
            MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &u,  &u, &T[i]->Z ) );
        }

        /*
         * proceed as in normalize()
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &ZZi,     &Zi,      &Zi  ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T[i]->X, &T[i]->X, &ZZi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T[i]->Y, &T[i]->Y, &ZZi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mod( grp, &T[i]->Y, &T[i]->Y, &Zi  ) );

        /*
         * Post-precessing: reclaim some memory by shrinking coordinates
         * - not storing Z (always 1)
         * - shrinking other coordinates, but still keeping the same number of
         *   limbs as P, as otherwise it will too likely be regrown too fast.
         */
        MBEDTLS_MPI_CHK( mbedtls_mpi_shrink( &T[i]->X, grp->P.n ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_shrink( &T[i]->Y, grp->P.n ) );
        mbedtls_mpi_free( &T[i]->Z );

        if( i == 0 )
            break;
    }

cleanup:

    mbedtls_mpi_free( &u ); mbedtls_mpi_free( &Zi ); mbedtls_mpi_free( &ZZi );
    for( i = 0; i < T_size; i++ )
        mbedtls_mpi_free( &c[i] );
    mbedtls_free( c );

    return( ret );
}